

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool __thiscall
testing::internal::QuantifierMatcherImpl<const_nsh_cmd_(&)[32]>::MatchAndExplainImpl
          (QuantifierMatcherImpl<const_nsh_cmd_(&)[32]> *this,bool all_elements_should_match,
          nsh_cmd (*container) [32],MatchResultListener *listener)

{
  bool bVar1;
  MatchResultListener *pMVar2;
  byte bVar3;
  unsigned_long local_218;
  MatcherBase<const_nsh_cmd_&> *local_210;
  StlContainerReference stl_container;
  string local_1e8;
  StringMatchResultListener inner_listener;
  
  stl_container.size_ = 0x20;
  stl_container.clone_ = (offset_in_NativeArray<nsh_cmd>_to_subr)NativeArray<nsh_cmd>::InitRef;
  stl_container._24_8_ = 0;
  local_210 = &(this->inner_matcher_).super_MatcherBase<const_nsh_cmd_&>;
  local_218 = 0;
  stl_container.array_ = *container;
  for (; bVar3 = all_elements_should_match, *container != stl_container.array_ + stl_container.size_
      ; container = (nsh_cmd (*) [32])((long)container + 0x18)) {
    StringMatchResultListener::StringMatchResultListener(&inner_listener);
    bVar1 = MatcherBase<const_nsh_cmd_&>::MatchAndExplain
                      (local_210,*container,&inner_listener.super_MatchResultListener);
    if (bVar1 != all_elements_should_match) {
      pMVar2 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
      pMVar2 = MatchResultListener::operator<<(pMVar2,&local_218);
      local_1e8._M_dataplus._M_p = " doesn\'t match";
      if (bVar1) {
        local_1e8._M_dataplus._M_p = " matches";
      }
      MatchResultListener::operator<<(pMVar2,(char **)&local_1e8);
      std::__cxx11::stringbuf::str();
      PrintIfNotEmpty(&local_1e8,listener->stream_);
      std::__cxx11::string::~string((string *)&local_1e8);
    }
    StringMatchResultListener::~StringMatchResultListener(&inner_listener);
    bVar3 = !all_elements_should_match;
    if (bVar1 != all_elements_should_match) break;
    local_218 = local_218 + 1;
  }
  NativeArray<nsh_cmd>::~NativeArray(&stl_container);
  return (bool)(bVar3 & 1);
}

Assistant:

bool MatchAndExplainImpl(bool all_elements_should_match, Container container,
                           MatchResultListener* listener) const {
    StlContainerReference stl_container = View::ConstReference(container);
    size_t i = 0;
    for (auto it = stl_container.begin(); it != stl_container.end();
         ++it, ++i) {
      StringMatchResultListener inner_listener;
      const bool matches = inner_matcher_.MatchAndExplain(*it, &inner_listener);

      if (matches != all_elements_should_match) {
        *listener << "whose element #" << i
                  << (matches ? " matches" : " doesn't match");
        PrintIfNotEmpty(inner_listener.str(), listener->stream());
        return !all_elements_should_match;
      }
    }
    return all_elements_should_match;
  }